

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

int32_t try_to_int(string *s)

{
  byte *pbVar1;
  int iVar2;
  pointer pcVar3;
  long *plVar4;
  long *plVar5;
  int iVar6;
  ulonglong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar3 = (s->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + s->_M_string_length)
  ;
  plVar4 = local_70;
  if (local_68 == 0) {
    plVar5 = local_70;
    uVar10 = 0;
  }
  else {
    uVar9 = 0;
    do {
      iVar6 = isspace((uint)*(byte *)((long)plVar4 + uVar9));
      plVar5 = local_70;
      uVar10 = uVar9;
      if (iVar6 == 0) break;
      uVar9 = uVar9 + 1;
      uVar10 = local_68;
    } while (local_68 != uVar9);
  }
  while ((plVar4 = local_70, uVar10 < local_68 &&
         (pbVar1 = (byte *)((long)local_70 + local_68), local_70 = plVar5,
         iVar6 = isspace((uint)*pbVar1), plVar5 = local_70, iVar6 != 0))) {
    local_68 = local_68 - 1;
    local_70 = plVar4;
  }
  local_70 = plVar5;
  std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
  std::__cxx11::string::operator=((string *)s,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (((2 < s->_M_string_length) && (plVar4 = (long *)(s->_M_dataplus)._M_p, (char)*plVar4 == '0'))
     && ((*(byte *)((long)plVar4 + 1) | 0x20) == 0x78)) {
    s = (string *)__errno_location();
    iVar6 = *(int *)&(s->_M_dataplus)._M_p;
    *(int *)&(s->_M_dataplus)._M_p = 0;
    uVar7 = strtoull((char *)plVar4,(char **)local_50,0);
    if (local_50[0] == plVar4) goto LAB_001156a0;
    iVar2 = *(int *)&(s->_M_dataplus)._M_p;
    if (iVar2 != 0) {
      if (iVar2 != 0x22) goto LAB_00115679;
      std::__throw_out_of_range("stoull");
      goto LAB_00115637;
    }
LAB_00115677:
    *(int *)&(s->_M_dataplus)._M_p = iVar6;
LAB_00115679:
    return (int32_t)uVar7;
  }
LAB_00115637:
  plVar4 = (long *)(s->_M_dataplus)._M_p;
  s = (string *)__errno_location();
  iVar6 = *(int *)&(s->_M_dataplus)._M_p;
  *(int *)&(s->_M_dataplus)._M_p = 0;
  uVar7 = strtol((char *)plVar4,(char **)local_50,10);
  if (local_50[0] == plVar4) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((long)(int)uVar7 == uVar7) && (iVar2 = *(int *)&(s->_M_dataplus)._M_p, iVar2 != 0x22)) {
    if (iVar2 != 0) goto LAB_00115679;
    goto LAB_00115677;
  }
  std::__throw_out_of_range("stoi");
LAB_001156a0:
  uVar8 = std::__throw_invalid_argument("stoull");
  if (*(int *)&(s->_M_dataplus)._M_p == 0) {
    *(int *)&(s->_M_dataplus)._M_p = iVar6;
  }
  _Unwind_Resume(uVar8);
}

Assistant:

inline std::int32_t try_to_int(std::string s) {
    s = trim(s);
    if (s.length() > 2 && s[0] == '0' && (s[1] == 'x' || s[1] == 'X')) {
        return static_cast<std::int32_t>(std::stoull(s, 0, 0));
    }
    else {
        return std::stoi(s);
    }
}